

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.h
# Opt level: O1

Vector * __thiscall
anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>::point_at
          (Vector *__return_storage_ptr__,
          Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_> *this,double u,double v)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  peVar1 = (this->m_surface_geometry).m_entry.
           super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar2 = (peVar1->m_data).
           super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (peVar1->m_data).
            super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  (*(peVar2->super_SurfaceBase<3L>)._vptr_SurfaceBase[6])(__return_storage_ptr__);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector point_at(const double u, const double v) const override
    {
        return m_surface_geometry->point_at(u, v);
    }